

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::resolveNewVertex
          (SignpostIntrinsicTriangulation *this,Vertex newV,SurfacePoint intrinsicPoint)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  pointer puVar4;
  pointer puVar5;
  IntrinsicGeometryInterface *geom;
  SurfacePoint *pSVar6;
  unsigned_long uVar7;
  SurfacePoint *pSVar8;
  Vector2 *pVVar9;
  ParentMeshT *pPVar10;
  long lVar11;
  SurfacePoint startP;
  size_t i_1;
  ulong uVar12;
  runtime_error *this_00;
  size_t i_6;
  size_t sVar13;
  ulong *puVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  size_t i;
  ulong uVar19;
  size_t i_4;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  Halfedge he;
  Face f;
  Halfedge he_00;
  Vector2 traceVec;
  size_t i_2;
  TraceOptions options;
  TraceGeodesicResult inputTraceResult;
  TraceOptions local_160;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  undefined8 uStack_118;
  ParentMeshT *pPStack_110;
  size_t sStack_108;
  ParentMeshT *local_100;
  size_t sStack_f8;
  double dStack_f0;
  ParentMeshT *pPStack_e8;
  size_t sStack_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  TraceGeodesicResult local_b8;
  
  sVar13 = newV.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
  he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
       newV.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
       mesh;
  uVar12 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar13];
  uVar19 = uVar12;
  do {
    uVar15 = uVar19;
    uVar19 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar15];
    uVar17 = uVar15;
  } while (uVar19 != uVar12);
  do {
    he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind
         = uVar17;
    updateAngleFromCWNeighor(this,he);
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->useImplicitTwinFlag == true) {
      uVar17 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17] ^ 1;
    }
    else {
      uVar17 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heVertInNextArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
    }
  } while (uVar17 != uVar15);
  puVar4 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar13];
  uVar19 = (he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->nFacesFillCount;
  uVar17 = uVar12;
  do {
    uVar15 = uVar12;
    if (puVar4[uVar17] < uVar19) break;
    puVar14 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heVertOutNextArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + uVar17;
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->useImplicitTwinFlag != false) {
      puVar14 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar17 ^ 1);
    }
    uVar17 = *puVar14;
  } while (uVar17 != uVar12);
  do {
    uVar20 = puVar4[uVar15];
    if (uVar20 < uVar19) break;
    puVar14 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heVertOutNextArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + uVar15;
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->useImplicitTwinFlag != false) {
      puVar14 = ((he.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar15 ^ 1);
    }
    uVar15 = *puVar14;
  } while (uVar15 != uVar12);
  if (uVar20 < uVar19) goto LAB_001a1808;
  while (uVar15 != uVar17) {
LAB_001a1808:
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         ((he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar15];
    f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
         .mesh;
    updateFaceBasis(this,f);
    puVar4 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heVertOutNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar14 = puVar4 + uVar15;
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->useImplicitTwinFlag != false) {
      puVar14 = puVar5 + (uVar15 ^ 1);
    }
    uVar15 = *puVar14;
    while ((he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->nFacesFillCount <=
           ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar15]) {
      puVar14 = puVar5 + (uVar15 ^ 1);
      if ((he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag == false) {
        puVar14 = puVar4 + uVar15;
      }
      uVar15 = *puVar14;
    }
  }
  uVar12 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar13];
  bVar3 = (he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar3 == true) {
    uVar19 = uVar12 ^ 1;
  }
  else {
    uVar19 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
  }
  puVar4 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar17 = uVar12;
  do {
    uVar15 = uVar17;
    uVar17 = puVar4[uVar15];
  } while (uVar17 != uVar12);
  dVar23 = 0.0;
  iVar18 = 9999;
  uVar17 = uVar15;
  do {
    if (bVar3 == false) {
      uVar20 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17];
    }
    else {
      uVar20 = uVar17 >> 1;
    }
    iVar16 = 2 - (uint)((this->vertexLocations).data.
                        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
                        .m_storage.m_data
                        [((he.
                           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->heVertexArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar19]].type == Vertex);
    if (bVar3 == false) {
      uVar7 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17]];
      bVar21 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7] == uVar7;
    }
    else {
      bVar21 = (he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->nFacesFillCount <=
               ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[(uVar17 & 0xfffffffffffffffe) + 1];
    }
    dVar22 = (this->intrinsicEdgeLengths).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar20]
    ;
    if (bVar21) {
      iVar16 = 3;
    }
    if ((iVar16 < iVar18) || ((iVar16 <= iVar18 && (dVar22 < dVar23)))) {
      uVar19 = uVar17;
      iVar18 = iVar16;
      dVar23 = dVar22;
    }
    if (bVar3 == false) {
      uVar17 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heVertInNextArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
    }
    else {
      uVar17 = puVar4[uVar17] ^ 1;
    }
  } while (uVar17 != uVar15);
  if (intrinsicPoint.type == Edge) {
    if ((intrinsicPoint.edge.
         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh)
        ->useImplicitTwinFlag == true) {
      bVar21 = (intrinsicPoint.edge.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->nFacesFillCount <=
               ((intrinsicPoint.edge.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start
               [intrinsicPoint.edge.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                .ind * 2 + 1];
    }
    else {
      uVar7 = ((intrinsicPoint.edge.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->eHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [intrinsicPoint.edge.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
               ind];
      bVar21 = ((intrinsicPoint.edge.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7] == uVar7;
    }
    if (bVar21) {
      if (bVar3 == false) {
        uVar12 = ((he.
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->heSiblingArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
      }
      else {
        uVar12 = uVar12 ^ 1;
      }
      pSVar8 = (this->vertexLocations).data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
               .m_storage.m_data;
      uVar7 = ((he.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heVertexArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      pPVar10 = pSVar8[uVar7].vertex.
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
      lVar11 = *(long *)&(pPVar10->heNextArr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      uVar12 = *(ulong *)(*(long *)&(pPVar10->vHalfedgeArr).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl +
                         pSVar8[uVar7].vertex.
                         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                         .ind * 8);
      uVar19 = uVar12;
      do {
        uVar17 = uVar19;
        uVar19 = *(ulong *)(lVar11 + uVar17 * 8);
      } while (uVar19 != uVar12);
      uVar12 = uVar17;
      do {
        if (pPVar10->useImplicitTwinFlag == false) {
          uVar12 = *(ulong *)(*(long *)&(pPVar10->heVertInNextArr).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl + uVar12 * 8);
        }
        else {
          uVar12 = *(ulong *)(lVar11 + uVar12 * 8) ^ 1;
        }
      } while (uVar12 != uVar17);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,
                 "edge split problem: no boundary edge connecting vertices in boundary insertion");
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_160.includePath = false;
  local_160.errorOnProblem = false;
  local_160.barrierEdges = (EdgeData<bool> *)0x0;
  local_160.maxIters = 0xffffffffffffffff;
  geom = this->inputGeom;
  pSVar6 = (this->vertexLocations).data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
  puVar4 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = puVar4[uVar19];
  pSVar8 = pSVar6 + uVar7;
  uStack_118 = *(undefined8 *)pSVar8;
  pPStack_110 = (pSVar8->vertex).
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
  sStack_108 = (pSVar8->vertex).
               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
               .ind;
  local_100 = (pSVar8->edge).
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              mesh;
  sStack_f8 = (pSVar8->edge).
              super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              ind;
  dStack_f0 = pSVar8->tEdge;
  pPStack_e8 = (pSVar8->face).
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
               mesh;
  sStack_e0 = (pSVar8->face).
              super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              ind;
  dStack_d8 = pSVar6[uVar7].faceCoords.x;
  dStack_d0 = pSVar6[uVar7].faceCoords.y;
  dStack_c8 = pSVar6[uVar7].faceCoords.z;
  uVar7 = puVar4[uVar19];
  uVar12 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar7];
  if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh)->useImplicitTwinFlag == true) {
    uVar12 = uVar12 ^ 1;
  }
  else {
    uVar12 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
  }
  dVar23 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar19] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar7] /
                  *(double *)
                   (&DAT_0029b9c0 +
                   (ulong)(((he.
                             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .mesh)->heFaceArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar12] <
                          (he.
                           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          .mesh)->nFacesFillCount) * 8)));
  dVar22 = cos(dVar23);
  dVar23 = sin(dVar23);
  if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh)->useImplicitTwinFlag == true) {
    uVar12 = uVar19 >> 1;
  }
  else {
    uVar12 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar19];
  }
  dVar1 = (this->intrinsicEdgeLengths).data.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12];
  startP.vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       pPStack_110;
  startP._0_8_ = uStack_118;
  startP.vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       sStack_108;
  startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
  mesh = local_100;
  startP.edge.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
  ind = sStack_f8;
  startP.tEdge = dStack_f0;
  startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
  mesh = pPStack_e8;
  startP.face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
  ind = sStack_e0;
  startP.faceCoords.x = dStack_d8;
  startP.faceCoords.y = dStack_d0;
  startP.faceCoords.z = dStack_c8;
  traceVec.y = dVar23 * dVar1;
  traceVec.x = dVar1 * dVar22;
  traceGeodesic(&local_b8,geom,startP,traceVec,&local_160);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_b8.endPoint._0_8_;
  dVar22 = -local_b8.endingDir.y;
  dVar23 = -local_b8.endingDir.x;
  if (local_b8.pathPoints.
      super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_128 = local_b8.endPoint.faceCoords.x;
    dStack_120 = local_b8.endPoint.faceCoords.y;
    uStack_130 = 0x8000000000000000;
    uStack_140 = 0x8000000000000000;
    local_148 = -local_b8.endingDir.y;
    local_138 = -local_b8.endingDir.x;
    operator_delete(local_b8.pathPoints.
                    super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    dVar22 = local_148;
    dVar23 = local_138;
    local_b8.endPoint.faceCoords.x = local_128;
    local_b8.endPoint.faceCoords.y = dStack_120;
  }
  pSVar8 = (this->vertexLocations).data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::SurfacePoint,__1,_1,_0,__1,_1>_>
           .m_storage.m_data;
  uVar2 = vmovlps_avx(auVar24);
  *(undefined8 *)(pSVar8 + sVar13) = uVar2;
  pSVar8[sVar13].vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_b8.endPoint.vertex.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar8[sVar13].vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       local_b8.endPoint.vertex.
       super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar8[sVar13].edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_b8.endPoint.edge.
       super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar8[sVar13].edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
       local_b8.endPoint.edge.
       super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar8[sVar13].tEdge = local_b8.endPoint.tEdge;
  pSVar8[sVar13].face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       local_b8.endPoint.face.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
  pSVar8[sVar13].face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       local_b8.endPoint.face.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind;
  pSVar8[sVar13].faceCoords.x = local_b8.endPoint.faceCoords.x;
  pSVar8[sVar13].faceCoords.y = local_b8.endPoint.faceCoords.y;
  pSVar8[sVar13].faceCoords.z = local_b8.endPoint.faceCoords.z;
  dVar23 = atan2(dVar22,dVar23);
  uVar12 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar13];
  if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh)->useImplicitTwinFlag == true) {
    uVar12 = uVar12 ^ 1;
  }
  else {
    uVar12 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
  }
  if (((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
       mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] <
      (he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh)->nFacesFillCount) {
    dVar23 = fmod(dVar23,(this->intrinsicVertexAngleSums).data.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[sVar13]);
  }
  puVar4 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar12 = (he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->nFacesFillCount;
  bVar3 = (he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar3 == true) {
    uVar17 = uVar19 ^ 1;
  }
  else {
    uVar17 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  }
  (this->intrinsicHalfedgeDirections).data.
  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar17] =
       (double)((ulong)(puVar4[uVar19] < uVar12) * (long)dVar23);
  if (bVar3 == false) {
    uVar17 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  }
  else {
    uVar17 = uVar19 ^ 1;
  }
  uVar7 = ((he.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
           .mesh)->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar17];
  uVar15 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar7];
  if (bVar3 == false) {
    uVar15 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15];
  }
  else {
    uVar15 = uVar15 ^ 1;
  }
  dVar23 = (this->intrinsicHalfedgeDirections).data.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar17] *
           (1.0 / ((this->intrinsicVertexAngleSums).data.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   [uVar7] / *(double *)(&DAT_0029b9c0 + (ulong)(puVar4[uVar15] < uVar12) * 8)));
  dVar22 = cos(dVar23);
  dVar23 = sin(dVar23);
  bVar3 = (he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag;
  if (bVar3 == true) {
    uVar17 = uVar17 >> 1;
  }
  else {
    uVar17 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar17];
  }
  dVar1 = (this->intrinsicEdgeLengths).data.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar17];
  if (bVar3 == false) {
    uVar12 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  }
  else {
    uVar12 = uVar19 ^ 1;
  }
  pVVar9 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
           super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  pVVar9[uVar12].x = dVar1 * dVar22;
  pVVar9[uVar12].y = dVar23 * dVar1;
  if (bVar3 == false) {
    uVar19 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar19];
  }
  else {
    uVar19 = uVar19 ^ 1;
  }
  puVar4 = ((he.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar12 = puVar4[puVar4[uVar19]];
  if (bVar3 == false) {
    uVar12 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
  }
  else {
    uVar12 = uVar12 ^ 1;
  }
  do {
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = uVar12;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = he.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
           mesh;
    updateAngleFromCWNeighor(this,he_00);
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->nFacesFillCount <=
        ((he.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
         mesh)->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start[uVar12]) {
      return;
    }
    puVar4 = ((he.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              .mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = puVar4[puVar4[uVar12]];
    if ((he.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
        .mesh)->useImplicitTwinFlag == true) {
      uVar12 = uVar12 ^ 1;
    }
    else {
      uVar12 = ((he.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh)->heSiblingArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
    }
  } while (uVar12 != uVar19);
  return;
}

Assistant:

void SignpostIntrinsicTriangulation::resolveNewVertex(Vertex newV, SurfacePoint intrinsicPoint) {

  // == (1) Compute angular coordinates for the halfedges
  // Now that we have valid edge lengths, compute halfedge angular coordinates for our new vertex
  for (Halfedge heIn : newV.incomingHalfedges()) {
    updateAngleFromCWNeighor(heIn);
  }

  // == (2) Set up bases on the intrinsic faces
  for (Face f : newV.adjacentFaces()) {
    updateFaceBasis(f);
  }

  // == (3) Find the insertion point on the input mesh, use it to align tangent spaces

  // Heuristic: we have to choose some edge to trace from to resolve the vertex. Use the shortest one, as it will often
  // involve the fewest crossings. Furthermore, use an original vertex if possible to reduce accumulating numerical
  // error.
  /*
  Halfedge inputTraceHe = newV.halfedge().twin();
  double shortestTraceHeLen = intrinsicEdgeLengths[inputTraceHe.edge()];
  for (Halfedge heIn : newV.incomingHalfedges()) {
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    bool currVertIsOriginal = vertexLocations[inputTraceHe.vertex()].type == SurfacePointType::Vertex;
    bool newVertIsOriginal = vertexLocations[heIn.vertex()].type == SurfacePointType::Vertex;

    if (currVertIsOriginal && !newVertIsOriginal) continue;

    if ((newVertIsOriginal && !currVertIsOriginal) || thisLen < shortestTraceHeLen) {
      shortestTraceHeLen = thisLen;
      inputTraceHe = heIn;
    }
  }
  */


  // We have to choose some edge to trace from to resolve the vertex. Choose from neighbors according to the following
  // priority:
  //  (best)    original points
  //  (neutral) other points
  //  (worst)   boundary points
  //  [break ties by shortest edge length]
  Halfedge inputTraceHe = newV.halfedge().twin();
  std::tuple<int, double> priorityBest{9999, 0};
  for (Halfedge heIn : newV.incomingHalfedges()) {

    // length score
    double thisLen = intrinsicEdgeLengths[heIn.edge()];

    // type score
    int numScore = 2;
    SurfacePoint candidateLoc = vertexLocations[inputTraceHe.vertex()];
    if (candidateLoc.type == SurfacePointType::Vertex) {
      numScore = 1;
    }
    if (heIn.edge().isBoundary()) {
      numScore = 3;
    }

    // combined score
    std::tuple<int, double> priorityThis{numScore, thisLen};

    // keep best
    if (priorityThis < priorityBest) {
      priorityBest = priorityThis;
      inputTraceHe = heIn;
    }
  }

  // Trace from the adjacent vertex selected above to get the position/angle on the input mesh
  SurfacePoint newPositionOnInput;
  Vector2 outgoingVec;

  bool boundaryEdgeInsertion = (intrinsicPoint.type == SurfacePointType::Edge && intrinsicPoint.edge.isBoundary());
  if (boundaryEdgeInsertion) {
    // For boundary vertices, instead of tracing, directly interpolate along the edge
    inputTraceHe = newV.halfedge().twin();

    // Get t values along the edge for previous and next vertices (note that we must be along a single edge)
    double tPrev, tNext;
    Edge origEdge;

    Vertex nextV = newV.halfedge().twin().vertex();
    if (vertexLocations[nextV].type == SurfacePointType::Vertex) {
      tNext = 1.;
    } else /* SurfacePointType::Edge */ {
      tNext = vertexLocations[nextV].tEdge;
      origEdge = vertexLocations[nextV].edge;
    }

    Vertex prevV = newV.halfedge().twin().next().twin().vertex();
    if (vertexLocations[prevV].type == SurfacePointType::Vertex) {
      tPrev = 0.;
    } else /* SurfacePointType::Edge */ {
      tPrev = vertexLocations[prevV].tEdge;
      origEdge = vertexLocations[prevV].edge;
    }

    // If neither was along an edge, find the (should-be-unique) boundary edge connecting the vertices
    if (origEdge == Edge()) {
      Vertex nextVOrig = vertexLocations[nextV].vertex;
      Vertex prevVOrig = vertexLocations[prevV].vertex;

      for (Halfedge he : nextVOrig.incomingHalfedges()) {
        if (he.vertex() == prevVOrig && he.edge().isBoundary()) {
          origEdge = he.edge();
        }
      }
    }

    if (origEdge == Edge()) {
      throw std::runtime_error("edge split problem: no boundary edge connecting vertices in boundary insertion");
    }

    // Interpolate between the previous and next t values
    double localT = intrinsicPoint.tEdge;
    double thisT = (1. - localT) * tPrev + (localT)*tNext;

    newPositionOnInput = SurfacePoint(origEdge, thisT);
  } else {
    // Normal case: trace an edge inward, use the result to resolve position and tangent basis
    // std::cout << "tracing to resolve new vertex" << std::endl;
    TraceOptions options;

    TraceGeodesicResult inputTraceResult =
        traceGeodesic(inputGeom, vertexLocations[inputTraceHe.vertex()], halfedgeVector(inputTraceHe), options);
    // std::cout << " --> done tracing to resolve new vertex" << std::endl;
    // snapEndToEdgeIfClose(inputTraceResult); TODO
    newPositionOnInput = inputTraceResult.endPoint;
    outgoingVec = -inputTraceResult.endingDir;
  }


  // Set the location of our newly inserted vertex
  vertexLocations[newV] = newPositionOnInput;

  // Align the new vertex's tangent space to that of the input mesh.
  double incomingAngle = standardizeAngle(newV, outgoingVec.arg());
  if (!inputTraceHe.isInterior()) {
    incomingAngle = 0;
  }

  intrinsicHalfedgeDirections[inputTraceHe.twin()] = incomingAngle;
  // halfedgeVectorsInVertex[inputTraceHe.twin()] = outgoingVec.normalize() * intrinsicEdgeLengths[inputTraceHe.edge()];
  halfedgeVectorsInVertex[inputTraceHe.twin()] = halfedgeVector(inputTraceHe.twin());

  // Custom loop to orbit CCW from InputTraceHe
  Halfedge firstHe = inputTraceHe.twin();
  Halfedge currHe = firstHe.next().next().twin();
  do {
    updateAngleFromCWNeighor(currHe);
    if (!currHe.isInterior()) break;
    currHe = currHe.next().next().twin();
  } while (currHe != firstHe);
}